

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O3

unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true> __thiscall
duckdb::ReservoirSample::Deserialize(ReservoirSample *this,Deserializer *deserializer)

{
  undefined1 auVar1 [8];
  _Head_base<0UL,_duckdb::ReservoirChunk_*,_false> _Var2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  _func_int **pp_Var5;
  ReservoirSample *this_00;
  undefined1 local_30 [8];
  _Head_base<0UL,_duckdb::ReservoirChunk_*,_false> local_28;
  idx_t sample_count;
  
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"sample_count");
  pp_Var5 = deserializer->_vptr_Deserializer;
  if ((char)uVar3 == '\0') {
    sample_count = 0;
  }
  else {
    iVar4 = (*pp_Var5[0x15])(deserializer);
    sample_count = CONCAT44(extraout_var,iVar4);
    pp_Var5 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var5[5])(deserializer,(ulong)(uVar3 & 0xff));
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ReservoirChunk,std::default_delete<duckdb::ReservoirChunk>,true>>
            ((Deserializer *)local_30,(field_id_t)deserializer,(char *)0xc9);
  this_00 = (ReservoirSample *)operator_new(0x58);
  local_28._M_head_impl = (ReservoirChunk *)local_30;
  local_30 = (undefined1  [8])0x0;
  ReservoirSample(this_00,sample_count,
                  (unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                   *)&local_28);
  _Var2._M_head_impl = local_28._M_head_impl;
  if (&(local_28._M_head_impl)->chunk != (DataChunk *)0x0) {
    DataChunk::~DataChunk(&(local_28._M_head_impl)->chunk);
    operator_delete(_Var2._M_head_impl);
  }
  auVar1 = local_30;
  local_28._M_head_impl = (ReservoirChunk *)0x0;
  (this->super_BlockingSample)._vptr_BlockingSample = (_func_int **)this_00;
  if (local_30 != (undefined1  [8])0x0) {
    DataChunk::~DataChunk((DataChunk *)local_30);
    operator_delete((void *)auVar1);
  }
  return (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)
         (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>)this;
}

Assistant:

unique_ptr<BlockingSample> ReservoirSample::Deserialize(Deserializer &deserializer) {
	auto sample_count = deserializer.ReadPropertyWithDefault<idx_t>(200, "sample_count");
	auto reservoir_chunk = deserializer.ReadPropertyWithDefault<unique_ptr<ReservoirChunk>>(201, "reservoir_chunk");
	auto result = duckdb::unique_ptr<ReservoirSample>(new ReservoirSample(sample_count, std::move(reservoir_chunk)));
	return std::move(result);
}